

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O2

uint16_t ans_reorder_fold_mapping_and_exceptions<5u>(uint32_t x,uint8_t **except_out)

{
  uint8_t *puVar1;
  short sVar2;
  
  sVar2 = 0;
  for (; 0xfff < x; x = x >> 8) {
    puVar1 = *except_out;
    sVar2 = sVar2 + 0xff0;
    *except_out = puVar1 + 1;
    *puVar1 = (uint8_t)x;
  }
  return (short)x + sVar2;
}

Assistant:

uint16_t ans_reorder_fold_mapping_and_exceptions(
    uint32_t x, uint8_t*& except_out)
{
    const uint32_t radix = 8;
    uint32_t radix_mask = ((1 << radix) - 1);
    size_t offset = 0;
    size_t thres = 1 << (fidelity + radix - 1);
    while (x >= thres) {
        *except_out++ = x & radix_mask;
        x = x >> radix;
        offset = offset + (1 << (fidelity - 1)) * radix_mask;
    }
    return x + offset;
}